

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void vdbeReleaseAndSetInt64(Mem *pMem,i64 val)

{
  sqlite3VdbeMemSetNull(pMem);
  (pMem->u).i = val;
  pMem->flags = 4;
  return;
}

Assistant:

static SQLITE_NOINLINE void vdbeReleaseAndSetInt64(Mem *pMem, i64 val){
  sqlite3VdbeMemSetNull(pMem);
  pMem->u.i = val;
  pMem->flags = MEM_Int;
}